

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurvey.c
# Opt level: O0

int xsurv0_pipe_init(void *arg,nni_pipe *npipe,void *s)

{
  int rv;
  xsurv0_pipe *p;
  void *s_local;
  nni_pipe *npipe_local;
  void *arg_local;
  
  nni_aio_init((nni_aio *)((long)arg + 0x28),xsurv0_getq_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x1f0),xsurv0_putq_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x3b8),xsurv0_send_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x580),xsurv0_recv_cb,arg);
  arg_local._4_4_ = nni_msgq_init((nni_msgq **)((long)arg + 0x10),0x10);
  if (arg_local._4_4_ == 0) {
    *(nni_pipe **)arg = npipe;
    *(void **)((long)arg + 8) = s;
    arg_local._4_4_ = 0;
  }
  else {
    xsurv0_pipe_fini(arg);
  }
  return arg_local._4_4_;
}

Assistant:

static int
xsurv0_pipe_init(void *arg, nni_pipe *npipe, void *s)
{
	xsurv0_pipe *p = arg;
	int          rv;

	nni_aio_init(&p->aio_getq, xsurv0_getq_cb, p);
	nni_aio_init(&p->aio_putq, xsurv0_putq_cb, p);
	nni_aio_init(&p->aio_send, xsurv0_send_cb, p);
	nni_aio_init(&p->aio_recv, xsurv0_recv_cb, p);

	// This depth could be tunable.  The queue exists so that if we
	// have multiple requests coming in faster than we can deliver them,
	// we try to avoid dropping them.  We don't really have a solution
	// for applying back pressure.  It would be nice if surveys carried
	// an expiration with them, so that we could discard any that are
	// not delivered before their expiration date.
	if ((rv = nni_msgq_init(&p->sendq, 16)) != 0) {
		xsurv0_pipe_fini(p);
		return (rv);
	}

	p->npipe = npipe;
	p->psock = s;
	return (0);
}